

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O2

void __thiscall mocker::ast::ASTRoot::~ASTRoot(ASTRoot *this)

{
  ~ASTRoot(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit ASTRoot(std::vector<std::shared_ptr<Declaration>> decls)
      : decls(std::move(decls)) {}